

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uscript.cpp
# Opt level: O0

int32_t getCodesFromLocale(char *locale,UScriptCode *scripts,int32_t capacity,UErrorCode *err)

{
  UBool UVar1;
  int iVar2;
  int32_t iVar3;
  UScriptCode local_4c;
  UScriptCode scriptCode;
  int32_t scriptLength;
  char script [8];
  char lang [8];
  UErrorCode internalErrorCode;
  UErrorCode *err_local;
  int32_t capacity_local;
  UScriptCode *scripts_local;
  char *locale_local;
  
  lang[0] = '\0';
  lang[1] = '\0';
  lang[2] = '\0';
  lang[3] = '\0';
  unique0x100001cc = err;
  UVar1 = U_FAILURE(*err);
  if (UVar1 == '\0') {
    uloc_getLanguage_63(locale,script,8,(UErrorCode *)lang);
    UVar1 = U_FAILURE(lang._0_4_);
    if ((UVar1 == '\0') && (lang._0_4_ != -0x7c)) {
      iVar2 = strcmp(script,"ja");
      if (iVar2 == 0) {
        locale_local._4_4_ = setCodes(JAPANESE,3,scripts,capacity,stack0xffffffffffffffd0);
      }
      else {
        iVar2 = strcmp(script,"ko");
        if (iVar2 == 0) {
          locale_local._4_4_ = setCodes(KOREAN,2,scripts,capacity,stack0xffffffffffffffd0);
        }
        else {
          iVar3 = uloc_getScript_63(locale,(char *)&scriptCode,8,(UErrorCode *)lang);
          UVar1 = U_FAILURE(lang._0_4_);
          if ((UVar1 == '\0') && (lang._0_4_ != -0x7c)) {
            iVar2 = strcmp(script,"zh");
            if ((iVar2 == 0) && (iVar2 = strcmp((char *)&scriptCode,"Hant"), iVar2 == 0)) {
              locale_local._4_4_ = setCodes(HAN_BOPO,2,scripts,capacity,stack0xffffffffffffffd0);
            }
            else if ((iVar3 == 0) ||
                    (local_4c = u_getPropertyValueEnum_63(UCHAR_SCRIPT,(char *)&scriptCode),
                    local_4c == USCRIPT_INVALID_CODE)) {
              locale_local._4_4_ = 0;
            }
            else {
              if ((local_4c == USCRIPT_SIMPLIFIED_HAN) || (local_4c == USCRIPT_TRADITIONAL_HAN)) {
                local_4c = USCRIPT_HAN;
              }
              locale_local._4_4_ = setOneCode(local_4c,scripts,capacity,stack0xffffffffffffffd0);
            }
          }
          else {
            locale_local._4_4_ = 0;
          }
        }
      }
    }
    else {
      locale_local._4_4_ = 0;
    }
  }
  else {
    locale_local._4_4_ = 0;
  }
  return locale_local._4_4_;
}

Assistant:

static int32_t
getCodesFromLocale(const char *locale,
                   UScriptCode *scripts, int32_t capacity, UErrorCode *err) {
    UErrorCode internalErrorCode = U_ZERO_ERROR;
    char lang[8];
    char script[8];
    int32_t scriptLength;
    if(U_FAILURE(*err)) { return 0; }
    // Multi-script languages, equivalent to the LocaleScript data
    // that we used to load from locale resource bundles.
    /*length = */ uloc_getLanguage(locale, lang, UPRV_LENGTHOF(lang), &internalErrorCode);
    if(U_FAILURE(internalErrorCode) || internalErrorCode == U_STRING_NOT_TERMINATED_WARNING) {
        return 0;
    }
    if(0 == uprv_strcmp(lang, "ja")) {
        return setCodes(JAPANESE, UPRV_LENGTHOF(JAPANESE), scripts, capacity, err);
    }
    if(0 == uprv_strcmp(lang, "ko")) {
        return setCodes(KOREAN, UPRV_LENGTHOF(KOREAN), scripts, capacity, err);
    }
    scriptLength = uloc_getScript(locale, script, UPRV_LENGTHOF(script), &internalErrorCode);
    if(U_FAILURE(internalErrorCode) || internalErrorCode == U_STRING_NOT_TERMINATED_WARNING) {
        return 0;
    }
    if(0 == uprv_strcmp(lang, "zh") && 0 == uprv_strcmp(script, "Hant")) {
        return setCodes(HAN_BOPO, UPRV_LENGTHOF(HAN_BOPO), scripts, capacity, err);
    }
    // Explicit script code.
    if(scriptLength != 0) {
        UScriptCode scriptCode = (UScriptCode)u_getPropertyValueEnum(UCHAR_SCRIPT, script);
        if(scriptCode != USCRIPT_INVALID_CODE) {
            if(scriptCode == USCRIPT_SIMPLIFIED_HAN || scriptCode == USCRIPT_TRADITIONAL_HAN) {
                scriptCode = USCRIPT_HAN;
            }
            return setOneCode(scriptCode, scripts, capacity, err);
        }
    }
    return 0;
}